

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

bool __thiscall draco::ObjEncoder::GetSubObjects(ObjEncoder *this)

{
  bool bVar1;
  uint8_t uVar2;
  AttributeMetadata *value_00;
  PointCloud *pPVar3;
  mapped_type *this_00;
  PointAttribute *pPVar4;
  size_t sVar5;
  allocator<char> *in_RDI;
  int value;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>
  *entry;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
  *__range1;
  AttributeMetadata *sub_obj_metadata;
  GeometryMetadata *pc_metadata;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
  *in_stack_ffffffffffffff18;
  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff20;
  uint32_t unique_id;
  PointCloud *in_stack_ffffffffffffff28;
  EntryValue *this_01;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  _Self local_98;
  _Self local_90;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  GeometryMetadata *in_stack_ffffffffffffff88;
  allocator<char> local_41;
  string local_40 [32];
  AttributeMetadata *local_20;
  GeometryMetadata *local_18;
  bool local_1;
  
  local_18 = PointCloud::GetMetadata((PointCloud *)0x123625);
  if (local_18 == (GeometryMetadata *)0x0) {
    local_1 = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,
               (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),in_RDI);
    this_01 = (EntryValue *)&stack0xffffffffffffff87;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,
               (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),in_RDI);
    value_00 = GeometryMetadata::GetAttributeMetadataByStringEntry
                         (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    if (value_00 == (AttributeMetadata *)0x0) {
      local_1 = true;
    }
    else {
      local_20 = value_00;
      std::
      unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x12379c);
      Metadata::entries_abi_cxx11_(&local_20->super_Metadata);
      local_90._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
           ::begin(in_stack_ffffffffffffff18);
      local_98._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
           ::end(in_stack_ffffffffffffff18);
      while (bVar1 = std::operator!=(&local_90,&local_98), bVar1) {
        pPVar3 = (PointCloud *)
                 std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>
                 ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>
                              *)in_stack_ffffffffffffff20);
        bVar1 = EntryValue::GetValue<int>(this_01,(int *)value_00);
        if (bVar1) {
          this_00 = std::
                    unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](in_stack_ffffffffffffff20,(key_type *)in_stack_ffffffffffffff18);
          std::__cxx11::string::operator=((string *)this_00,(string *)pPVar3);
          in_stack_ffffffffffffff28 = pPVar3;
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>
        ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>
                      *)in_stack_ffffffffffffff20);
      }
      unique_id = (uint32_t)((ulong)*(undefined8 *)(in_RDI + 0x50) >> 0x20);
      AttributeMetadata::att_unique_id(local_20);
      pPVar4 = PointCloud::GetAttributeByUniqueId(in_stack_ffffffffffffff28,unique_id);
      *(PointAttribute **)(in_RDI + 0x20) = pPVar4;
      if (((*(long *)(in_RDI + 0x20) == 0) ||
          (sVar5 = PointAttribute::size(*(PointAttribute **)(in_RDI + 0x20)), sVar5 == 0)) ||
         (uVar2 = GeometryAttribute::num_components(*(GeometryAttribute **)(in_RDI + 0x20)),
         uVar2 != '\x01')) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool ObjEncoder::GetSubObjects() {
  const GeometryMetadata *pc_metadata = in_point_cloud_->GetMetadata();
  if (!pc_metadata) {
    return true;
  }
  const AttributeMetadata *sub_obj_metadata =
      pc_metadata->GetAttributeMetadataByStringEntry("name", "sub_obj");
  if (!sub_obj_metadata) {
    return true;
  }
  sub_obj_id_to_name_.clear();
  for (const auto &entry : sub_obj_metadata->entries()) {
    // Sub-object id must be int.
    int value = 0;
    if (!entry.second.GetValue(&value)) {
      continue;
    }
    sub_obj_id_to_name_[value] = entry.first;
  }
  sub_obj_att_ = in_point_cloud_->GetAttributeByUniqueId(
      sub_obj_metadata->att_unique_id());
  if (sub_obj_att_ == nullptr || sub_obj_att_->size() == 0 ||
      sub_obj_att_->num_components() != 1) {
    return false;
  }
  return true;
}